

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O2

curl_slist * curl_slist_append(curl_slist *list,char *data)

{
  char *data_00;
  curl_slist *pcVar1;
  
  data_00 = (*Curl_cstrdup)(data);
  if (data_00 != (char *)0x0) {
    pcVar1 = Curl_slist_append_nodup(list,data_00);
    if (pcVar1 != (curl_slist *)0x0) {
      return pcVar1;
    }
    (*Curl_cfree)(data_00);
  }
  return (curl_slist *)0x0;
}

Assistant:

struct curl_slist *curl_slist_append(struct curl_slist *list,
                                     const char *data)
{
  char *dupdata = strdup(data);

  if(!dupdata)
    return NULL;

  list = Curl_slist_append_nodup(list, dupdata);
  if(!list)
    free(dupdata);

  return list;
}